

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O3

bool __thiscall spvtools::opt::anon_unknown_0::LoopUnswitch::CanUnswitchLoop(LoopUnswitch *this)

{
  IRContext *pIVar1;
  CFG *this_00;
  pointer pOVar2;
  uint **ppuVar3;
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> entry;
  bool bVar4;
  int32_t iVar5;
  BasicBlock *pBVar6;
  uint **ppuVar7;
  Instruction *pIVar8;
  DominatorTree *post_dom_tree;
  _Hash_node_base *p_Var9;
  
  bVar4 = true;
  if (this->switch_block_ == (BasicBlock *)0x0) {
    bVar4 = Loop::IsSafeToClone(this->loop_);
    if (bVar4) {
      bVar4 = false;
    }
    else {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
      }
      p_Var9 = (this->loop_->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        this_00 = (pIVar1->cfg_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                  .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
        do {
          pBVar6 = CFG::block(this_00,*(uint32_t *)&p_Var9[1]._M_nxt);
          if (this->loop_->loop_latch_ != pBVar6) {
            pIVar8 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
            if ((pIVar8 == (Instruction *)0x0) ||
               ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
               ) {
LAB_002558af:
              __assert_fail("!insts_.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                            ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
            }
            bVar4 = spvOpcodeIsBranch(((pBVar6->insts_).
                                       super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                                       super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                                      previous_node_)->opcode_);
            if (bVar4) {
              pIVar8 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                       super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
              if ((pIVar8 == (Instruction *)0x0) ||
                 ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ !=
                  false)) goto LAB_002558af;
              pIVar8 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                       super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
              if (pIVar8->opcode_ != OpBranch) {
                bVar4 = spvOpcodeIsBranch(pIVar8->opcode_);
                if (!bVar4) {
                  __assert_fail("insn->IsBranch()",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                                ,0x225,
                                "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
                               );
                }
                if (pIVar8->opcode_ == OpBranch) {
                  __assert_fail("insn->opcode() != spv::Op::OpBranch",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                                ,0x226,
                                "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
                               );
                }
                pIVar1 = this->context_;
                if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                  IRContext::BuildDefUseManager(pIVar1);
                }
                pOVar2 = (pIVar8->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((pIVar8->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish == pOVar2) {
                  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                                ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
                }
                ppuVar3 = (uint **)(pOVar2->words).large_data_._M_t.
                                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                   ._M_head_impl;
                ppuVar7 = &(pOVar2->words).small_data_;
                if (ppuVar3 != (uint **)0x0) {
                  ppuVar7 = ppuVar3;
                }
                pIVar8 = analysis::DefUseManager::GetDef
                                   ((pIVar1->def_use_mgr_)._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                    .
                                    super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                    ._M_head_impl,**ppuVar7);
                iVar5 = spvOpcodeIsConstant(pIVar8->opcode_);
                if (iVar5 != 0) {
                  iVar5 = spvOpcodeIsSpecConstant(pIVar8->opcode_);
                  if (iVar5 == 0) goto LAB_00255885;
                }
                bVar4 = Loop::IsInsideLoop(this->loop_,pIVar8);
                if (!bVar4) {
                  entry._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
                       (((this->function_->blocks_).
                         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       ._M_t;
                  post_dom_tree =
                       (DominatorTree *)
                       IRContext::GetPostDominatorAnalysis(this->context_,this->function_);
                  bVar4 = IsDynamicallyUniform
                                    (this,pIVar8,
                                     (BasicBlock *)
                                     entry._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                                     _M_head_impl,post_dom_tree);
                  if (bVar4) {
                    this->switch_block_ = pBVar6;
                    break;
                  }
                }
              }
            }
          }
LAB_00255885:
          p_Var9 = p_Var9->_M_nxt;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      bVar4 = this->switch_block_ != (BasicBlock *)0x0;
    }
  }
  return bVar4;
}

Assistant:

bool CanUnswitchLoop() {
    if (switch_block_) return true;
    if (loop_->IsSafeToClone()) return false;

    CFG& cfg = *context_->cfg();

    for (uint32_t bb_id : loop_->GetBlocks()) {
      BasicBlock* bb = cfg.block(bb_id);
      if (loop_->GetLatchBlock() == bb) {
        continue;
      }

      if (bb->terminator()->IsBranch() &&
          bb->terminator()->opcode() != spv::Op::OpBranch) {
        if (IsConditionNonConstantLoopInvariant(bb->terminator())) {
          switch_block_ = bb;
          break;
        }
      }
    }

    return switch_block_;
  }